

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Demo6502.cpp
# Opt level: O0

void __thiscall DemoM6502::DemoM6502(DemoM6502 *this)

{
  DemoM6502 *this_local;
  
  olc::PixelGameEngine::PixelGameEngine(&this->super_PixelGameEngine);
  (this->super_PixelGameEngine)._vptr_PixelGameEngine = (_func_int **)&PTR__DemoM6502_0018b870;
  std::shared_ptr<Catridge>::shared_ptr(&this->cart);
  Bus::Bus(&this->nes);
  std::
  map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->mapAsm);
  this->bEmulationRun = false;
  this->fResidualTime = 0.0;
  this->nSelectedPalette = '\0';
  std::__cxx11::string::operator=
            ((string *)&(this->super_PixelGameEngine).sAppName,"m6502 Demonstration");
  return;
}

Assistant:

DemoM6502() { sAppName = "m6502 Demonstration"; }